

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersector1<8,_1,_false,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMiIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  float **ppfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  undefined1 auVar44 [32];
  uint uVar45;
  uint uVar46;
  uint uVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 in_ZMM30 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  int local_145c;
  Ray *local_1458;
  RTCIntersectArguments *local_1450;
  Scene *local_1448;
  Geometry *local_1440;
  ulong local_1438;
  ulong local_1430;
  ulong local_1428;
  ulong *local_1420;
  long local_1418;
  long local_1410;
  undefined4 local_1408;
  undefined4 local_1404;
  undefined4 local_1400;
  undefined4 local_13fc;
  undefined4 local_13f8;
  undefined4 local_13f4;
  uint local_13f0;
  uint local_13ec;
  uint local_13e8;
  RTCFilterFunctionNArguments local_13d8;
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  undefined8 local_1398;
  undefined8 uStack_1390;
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  undefined1 local_1358 [16];
  byte local_1347;
  float local_1338 [4];
  undefined1 local_1328 [16];
  float local_1318 [4];
  undefined1 local_1308 [16];
  undefined1 local_12f8 [16];
  undefined1 local_12e8 [16];
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  ulong local_11d8;
  ulong local_11d0 [564];
  
  local_11d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8 != 8) {
    if (0.0 <= ray->tfar) {
      local_1420 = local_11d0;
      aVar3 = (ray->dir).field_0.field_1;
      auVar25 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar22._8_4_ = 0x7fffffff;
      auVar22._0_8_ = 0x7fffffff7fffffff;
      auVar22._12_4_ = 0x7fffffff;
      auVar22 = vandps_avx512vl((undefined1  [16])aVar3,auVar22);
      auVar35._8_4_ = 0x219392ef;
      auVar35._0_8_ = 0x219392ef219392ef;
      auVar35._12_4_ = 0x219392ef;
      uVar17 = vcmpps_avx512vl(auVar22,auVar35,1);
      bVar21 = (bool)((byte)uVar17 & 1);
      auVar23._0_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * (int)aVar3.x;
      bVar21 = (bool)((byte)(uVar17 >> 1) & 1);
      auVar23._4_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * (int)aVar3.y;
      bVar21 = (bool)((byte)(uVar17 >> 2) & 1);
      auVar23._8_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * (int)aVar3.z;
      bVar21 = (bool)((byte)(uVar17 >> 3) & 1);
      auVar23._12_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * aVar3.field_3.a;
      auVar22 = vrcp14ps_avx512vl(auVar23);
      auVar24._8_4_ = 0x3f800000;
      auVar24._0_8_ = 0x3f8000003f800000;
      auVar24._12_4_ = 0x3f800000;
      auVar24 = vfnmadd213ps_avx512vl(auVar23,auVar22,auVar24);
      auVar23 = vfmadd132ps_fma(auVar24,auVar22,auVar22);
      auVar36 = vbroadcastss_avx512vl(auVar23);
      auVar49 = ZEXT3264(auVar36);
      auVar22 = vmovshdup_avx(auVar23);
      auVar36 = vbroadcastsd_avx512vl(auVar22);
      auVar50 = ZEXT3264(auVar36);
      auVar24 = vshufpd_avx(auVar23,auVar23,1);
      auVar37._8_4_ = 2;
      auVar37._0_8_ = 0x200000002;
      auVar37._12_4_ = 2;
      auVar37._16_4_ = 2;
      auVar37._20_4_ = 2;
      auVar37._24_4_ = 2;
      auVar37._28_4_ = 2;
      auVar36 = vpermps_avx512vl(auVar37,ZEXT1632(auVar23));
      auVar51 = ZEXT3264(auVar36);
      fVar40 = auVar23._0_4_ * (ray->org).field_0.m128[0];
      auVar44._4_4_ = fVar40;
      auVar44._0_4_ = fVar40;
      auVar44._8_4_ = fVar40;
      auVar44._12_4_ = fVar40;
      auVar44._16_4_ = fVar40;
      auVar44._20_4_ = fVar40;
      auVar44._24_4_ = fVar40;
      auVar44._28_4_ = fVar40;
      auVar36._8_4_ = 1;
      auVar36._0_8_ = 0x100000001;
      auVar36._12_4_ = 1;
      auVar36._16_4_ = 1;
      auVar36._20_4_ = 1;
      auVar36._24_4_ = 1;
      auVar36._28_4_ = 1;
      auVar38 = ZEXT1632(CONCAT412(auVar23._12_4_ * (ray->org).field_0.m128[3],
                                   CONCAT48(auVar23._8_4_ * (ray->org).field_0.m128[2],
                                            CONCAT44(auVar23._4_4_ * (ray->org).field_0.m128[1],
                                                     fVar40))));
      auVar36 = vpermps_avx2(auVar36,auVar38);
      auVar38 = vpermps_avx2(auVar37,auVar38);
      local_1428 = (ulong)(auVar23._0_4_ < 0.0) << 5;
      uVar18 = (ulong)(auVar22._0_4_ < 0.0) << 5 | 0x40;
      uVar17 = (ulong)(auVar24._0_4_ < 0.0) << 5 | 0x80;
      uVar19 = local_1428 ^ 0x20;
      auVar39._8_4_ = 0x80000000;
      auVar39._0_8_ = 0x8000000080000000;
      auVar39._12_4_ = 0x80000000;
      auVar39._16_4_ = 0x80000000;
      auVar39._20_4_ = 0x80000000;
      auVar39._24_4_ = 0x80000000;
      auVar39._28_4_ = 0x80000000;
      auVar37 = vxorps_avx512vl(auVar44,auVar39);
      auVar52 = ZEXT3264(auVar37);
      auVar36 = vxorps_avx512vl(auVar36,auVar39);
      auVar53 = ZEXT3264(auVar36);
      auVar36 = vxorps_avx512vl(auVar38,auVar39);
      auVar54 = ZEXT3264(auVar36);
      auVar36 = vbroadcastss_avx512vl(auVar25);
      auVar55 = ZEXT3264(auVar36);
      auVar36 = vbroadcastss_avx512vl(ZEXT416((uint)ray->tfar));
      auVar56 = ZEXT3264(auVar36);
      auVar25 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar57 = ZEXT1664(auVar25);
      auVar25 = vmovddup_avx512vl(ZEXT816(0x8000000080000000));
      auVar58 = ZEXT1664(auVar25);
      auVar25 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
      auVar59 = ZEXT1664(auVar25);
      auVar25 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar60 = ZEXT1664(auVar25);
      local_1458 = ray;
      do {
        uVar20 = local_1420[-1];
        local_1420 = local_1420 + -1;
        while ((uVar20 & 8) == 0) {
          auVar36 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar20 + 0x40 + local_1428),auVar52._0_32_,
                               auVar49._0_32_);
          auVar38 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar20 + 0x40 + uVar18),auVar53._0_32_,
                               auVar50._0_32_);
          auVar36 = vpmaxsd_avx2(auVar36,auVar38);
          auVar38 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar20 + 0x40 + uVar17),auVar54._0_32_,
                               auVar51._0_32_);
          auVar38 = vpmaxsd_avx512vl(auVar38,auVar55._0_32_);
          auVar36 = vpmaxsd_avx2(auVar36,auVar38);
          auVar38 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar20 + 0x40 + uVar19),auVar52._0_32_,
                               auVar49._0_32_);
          auVar37 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar20 + 0x40 + (uVar18 ^ 0x20)),
                               auVar53._0_32_,auVar50._0_32_);
          auVar38 = vpminsd_avx2(auVar38,auVar37);
          auVar37 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar20 + 0x40 + (uVar17 ^ 0x20)),
                               auVar54._0_32_,auVar51._0_32_);
          auVar37 = vpminsd_avx512vl(auVar37,auVar56._0_32_);
          auVar38 = vpminsd_avx2(auVar38,auVar37);
          uVar16 = vpcmpd_avx512vl(auVar36,auVar38,2);
          if ((char)uVar16 == '\0') goto LAB_00690bc3;
          uVar13 = uVar20 & 0xfffffffffffffff0;
          lVar14 = 0;
          for (uVar20 = uVar16; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
            lVar14 = lVar14 + 1;
          }
          uVar20 = *(ulong *)(uVar13 + lVar14 * 8);
          uVar15 = (uint)uVar16 - 1 & (uint)uVar16;
          uVar16 = (ulong)uVar15;
          if (uVar15 != 0) {
            *local_1420 = uVar20;
            lVar14 = 0;
            for (; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
              lVar14 = lVar14 + 1;
            }
            uVar15 = uVar15 - 1 & uVar15;
            uVar16 = (ulong)uVar15;
            bVar21 = uVar15 == 0;
            while( true ) {
              local_1420 = local_1420 + 1;
              uVar20 = *(ulong *)(uVar13 + lVar14 * 8);
              if (bVar21) break;
              *local_1420 = uVar20;
              lVar14 = 0;
              for (uVar20 = uVar16; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
                lVar14 = lVar14 + 1;
              }
              uVar16 = uVar16 - 1 & uVar16;
              bVar21 = uVar16 == 0;
            }
          }
        }
        local_1410 = (ulong)((uint)uVar20 & 0xf) - 8;
        if (local_1410 != 0) {
          uVar20 = uVar20 & 0xfffffffffffffff0;
          local_1448 = context->scene;
          local_1418 = 0;
          do {
            lVar14 = local_1418 * 0x50;
            ppfVar4 = (local_1448->vertices).items;
            pfVar5 = ppfVar4[*(uint *)(uVar20 + 0x30 + lVar14)];
            pfVar6 = ppfVar4[*(uint *)(uVar20 + 0x34 + lVar14)];
            pfVar7 = ppfVar4[*(uint *)(uVar20 + 0x38 + lVar14)];
            pfVar8 = ppfVar4[*(uint *)(uVar20 + 0x3c + lVar14)];
            auVar24 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar20 + lVar14)),
                                    *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar20 + 8 + lVar14)))
            ;
            auVar25 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar20 + lVar14)),
                                    *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar20 + 8 + lVar14)))
            ;
            auVar23 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar20 + 4 + lVar14)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar20 + 0xc + lVar14)));
            auVar22 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar20 + 4 + lVar14)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar20 + 0xc + lVar14)));
            auVar31 = vunpcklps_avx(auVar25,auVar22);
            auVar29 = vunpcklps_avx(auVar24,auVar23);
            auVar30 = vunpckhps_avx(auVar24,auVar23);
            auVar24 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar20 + 0x10 + lVar14)),
                                    *(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar20 + 0x18 + lVar14)));
            auVar25 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar20 + 0x10 + lVar14)),
                                    *(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar20 + 0x18 + lVar14)));
            auVar23 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar20 + 0x14 + lVar14)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar20 + 0x1c + lVar14)));
            auVar22 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar20 + 0x14 + lVar14)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar20 + 0x1c + lVar14)));
            auVar34 = vunpcklps_avx(auVar25,auVar22);
            auVar28 = vunpcklps_avx(auVar24,auVar23);
            auVar22 = vunpckhps_avx(auVar24,auVar23);
            auVar23 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar20 + 0x20 + lVar14)),
                                    *(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar20 + 0x28 + lVar14)));
            auVar25 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar20 + 0x20 + lVar14)),
                                    *(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar20 + 0x28 + lVar14)));
            auVar35 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar20 + 0x24 + lVar14)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar20 + 0x2c + lVar14)));
            auVar24 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar20 + 0x24 + lVar14)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar20 + 0x2c + lVar14)));
            auVar26 = vunpcklps_avx(auVar25,auVar24);
            auVar27 = vunpcklps_avx(auVar23,auVar35);
            puVar1 = (undefined8 *)(uVar20 + 0x30 + lVar14);
            local_1398 = *puVar1;
            uStack_1390 = puVar1[1];
            auVar35 = vunpckhps_avx(auVar23,auVar35);
            puVar1 = (undefined8 *)(uVar20 + 0x40 + lVar14);
            local_13a8 = *puVar1;
            uStack_13a0 = puVar1[1];
            auVar25 = vsubps_avx(auVar29,auVar28);
            auVar22 = vsubps_avx(auVar30,auVar22);
            auVar24 = vsubps_avx(auVar31,auVar34);
            auVar23 = vsubps_avx(auVar27,auVar29);
            auVar35 = vsubps_avx(auVar35,auVar30);
            auVar34 = vsubps_avx(auVar26,auVar31);
            auVar26._0_4_ = auVar22._0_4_ * auVar34._0_4_;
            auVar26._4_4_ = auVar22._4_4_ * auVar34._4_4_;
            auVar26._8_4_ = auVar22._8_4_ * auVar34._8_4_;
            auVar26._12_4_ = auVar22._12_4_ * auVar34._12_4_;
            local_1308 = vfmsub231ps_fma(auVar26,auVar35,auVar24);
            auVar27._0_4_ = auVar24._0_4_ * auVar23._0_4_;
            auVar27._4_4_ = auVar24._4_4_ * auVar23._4_4_;
            auVar27._8_4_ = auVar24._8_4_ * auVar23._8_4_;
            auVar27._12_4_ = auVar24._12_4_ * auVar23._12_4_;
            local_12f8 = vfmsub231ps_fma(auVar27,auVar34,auVar25);
            auVar32._0_4_ = auVar25._0_4_ * auVar35._0_4_;
            auVar32._4_4_ = auVar25._4_4_ * auVar35._4_4_;
            auVar32._8_4_ = auVar25._8_4_ * auVar35._8_4_;
            auVar32._12_4_ = auVar25._12_4_ * auVar35._12_4_;
            uVar2 = *(undefined4 *)&(local_1458->dir).field_0;
            auVar48._4_4_ = uVar2;
            auVar48._0_4_ = uVar2;
            auVar48._8_4_ = uVar2;
            auVar48._12_4_ = uVar2;
            auVar26 = vbroadcastss_avx512vl(ZEXT416((uint)(local_1458->dir).field_0.m128[1]));
            auVar27 = vbroadcastss_avx512vl(ZEXT416((uint)(local_1458->dir).field_0.m128[2]));
            uVar2 = *(undefined4 *)&(local_1458->org).field_0;
            auVar28._4_4_ = uVar2;
            auVar28._0_4_ = uVar2;
            auVar28._8_4_ = uVar2;
            auVar28._12_4_ = uVar2;
            auVar28 = vsubps_avx512vl(auVar29,auVar28);
            local_12e8 = vfmsub231ps_fma(auVar32,auVar23,auVar22);
            uVar2 = *(undefined4 *)((long)&(local_1458->org).field_0 + 4);
            auVar29._4_4_ = uVar2;
            auVar29._0_4_ = uVar2;
            auVar29._8_4_ = uVar2;
            auVar29._12_4_ = uVar2;
            auVar29 = vsubps_avx512vl(auVar30,auVar29);
            uVar2 = *(undefined4 *)((long)&(local_1458->org).field_0 + 8);
            auVar30._4_4_ = uVar2;
            auVar30._0_4_ = uVar2;
            auVar30._8_4_ = uVar2;
            auVar30._12_4_ = uVar2;
            auVar30 = vsubps_avx512vl(auVar31,auVar30);
            auVar31 = vmulps_avx512vl(auVar26,auVar30);
            auVar31 = vfmsub231ps_avx512vl(auVar31,auVar29,auVar27);
            auVar32 = vmulps_avx512vl(auVar27,auVar28);
            auVar32 = vfmsub231ps_avx512vl(auVar32,auVar30,auVar48);
            auVar33 = vmulps_avx512vl(auVar48,auVar29);
            auVar33 = vfmsub231ps_avx512vl(auVar33,auVar28,auVar26);
            auVar27 = vmulps_avx512vl(local_12e8,auVar27);
            auVar26 = vfmadd231ps_avx512vl(auVar27,local_12f8,auVar26);
            auVar26 = vfmadd231ps_avx512vl(auVar26,local_1308,auVar48);
            local_1358 = vandps_avx512vl(auVar26,auVar57._0_16_);
            auVar34 = vmulps_avx512vl(auVar34,auVar33);
            auVar35 = vfmadd231ps_avx512vl(auVar34,auVar32,auVar35);
            auVar23 = vfmadd231ps_fma(auVar35,auVar31,auVar23);
            auVar35 = vandps_avx512vl(auVar26,auVar58._0_16_);
            uVar15 = auVar35._0_4_;
            local_1388._0_4_ = (float)(uVar15 ^ auVar23._0_4_);
            uVar45 = auVar35._4_4_;
            local_1388._4_4_ = (float)(uVar45 ^ auVar23._4_4_);
            uVar46 = auVar35._8_4_;
            local_1388._8_4_ = (float)(uVar46 ^ auVar23._8_4_);
            uVar47 = auVar35._12_4_;
            local_1388._12_4_ = (float)(uVar47 ^ auVar23._12_4_);
            auVar24 = vmulps_avx512vl(auVar24,auVar33);
            auVar22 = vfmadd231ps_avx512vl(auVar24,auVar22,auVar32);
            auVar25 = vfmadd231ps_fma(auVar22,auVar25,auVar31);
            local_1378._0_4_ = (float)(uVar15 ^ auVar25._0_4_);
            local_1378._4_4_ = (float)(uVar45 ^ auVar25._4_4_);
            local_1378._8_4_ = (float)(uVar46 ^ auVar25._8_4_);
            local_1378._12_4_ = (float)(uVar47 ^ auVar25._12_4_);
            auVar25 = auVar59._0_16_;
            uVar9 = vcmpps_avx512vl(local_1388,auVar25,5);
            uVar10 = vcmpps_avx512vl(local_1378,auVar25,5);
            uVar11 = vcmpps_avx512vl(auVar26,auVar25,4);
            auVar25._0_4_ = local_1388._0_4_ + local_1378._0_4_;
            auVar25._4_4_ = local_1388._4_4_ + local_1378._4_4_;
            auVar25._8_4_ = local_1388._8_4_ + local_1378._8_4_;
            auVar25._12_4_ = local_1388._12_4_ + local_1378._12_4_;
            uVar12 = vcmpps_avx512vl(auVar25,local_1358,2);
            local_1347 = (byte)uVar9 & (byte)uVar10 & (byte)uVar11 & (byte)uVar12;
            if (local_1347 != 0) {
              auVar33._0_4_ = auVar30._0_4_ * local_12e8._0_4_;
              auVar33._4_4_ = auVar30._4_4_ * local_12e8._4_4_;
              auVar33._8_4_ = auVar30._8_4_ * local_12e8._8_4_;
              auVar33._12_4_ = auVar30._12_4_ * local_12e8._12_4_;
              auVar25 = vfmadd213ps_fma(auVar29,local_12f8,auVar33);
              auVar25 = vfmadd213ps_fma(auVar28,local_1308,auVar25);
              local_1368._0_4_ = (float)(uVar15 ^ auVar25._0_4_);
              local_1368._4_4_ = (float)(uVar45 ^ auVar25._4_4_);
              local_1368._8_4_ = (float)(uVar46 ^ auVar25._8_4_);
              local_1368._12_4_ = (float)(uVar47 ^ auVar25._12_4_);
              uVar2 = *(undefined4 *)((long)&(local_1458->org).field_0 + 0xc);
              auVar34._4_4_ = uVar2;
              auVar34._0_4_ = uVar2;
              auVar34._8_4_ = uVar2;
              auVar34._12_4_ = uVar2;
              auVar25 = vmulps_avx512vl(local_1358,auVar34);
              fVar40 = local_1458->tfar;
              auVar31._4_4_ = fVar40;
              auVar31._0_4_ = fVar40;
              auVar31._8_4_ = fVar40;
              auVar31._12_4_ = fVar40;
              auVar22 = vmulps_avx512vl(local_1358,auVar31);
              uVar9 = vcmpps_avx512vl(local_1368,auVar22,2);
              uVar10 = vcmpps_avx512vl(auVar25,local_1368,1);
              local_1347 = (byte)uVar9 & (byte)uVar10 & local_1347;
              if (local_1347 != 0) {
                auVar25 = vrcp14ps_avx512vl(local_1358);
                auVar22 = vfnmadd213ps_avx512vl(local_1358,auVar25,auVar60._0_16_);
                auVar25 = vfmadd132ps_fma(auVar22,auVar25,auVar25);
                fVar40 = auVar25._0_4_;
                fVar41 = auVar25._4_4_;
                fVar42 = auVar25._8_4_;
                fVar43 = auVar25._12_4_;
                local_1318[0] = fVar40 * local_1368._0_4_;
                local_1318[1] = fVar41 * local_1368._4_4_;
                local_1318[2] = fVar42 * local_1368._8_4_;
                local_1318[3] = fVar43 * local_1368._12_4_;
                local_1338[0] = fVar40 * local_1388._0_4_;
                local_1338[1] = fVar41 * local_1388._4_4_;
                local_1338[2] = fVar42 * local_1388._8_4_;
                local_1338[3] = fVar43 * local_1388._12_4_;
                local_1328._0_4_ = fVar40 * local_1378._0_4_;
                local_1328._4_4_ = fVar41 * local_1378._4_4_;
                local_1328._8_4_ = fVar42 * local_1378._8_4_;
                local_1328._12_4_ = fVar43 * local_1378._12_4_;
                local_1430 = (ulong)local_1347;
                do {
                  auVar25 = auVar59._0_16_;
                  local_1438 = 0;
                  for (uVar16 = local_1430; (uVar16 & 1) == 0;
                      uVar16 = uVar16 >> 1 | 0x8000000000000000) {
                    local_1438 = local_1438 + 1;
                  }
                  local_13f0 = *(uint *)((long)&local_1398 + local_1438 * 4);
                  local_1440 = (local_1448->geometries).items[local_13f0].ptr;
                  if ((local_1440->mask & local_1458->mask) == 0) {
                    local_1430 = local_1430 ^ 1L << (local_1438 & 0x3f);
                  }
                  else {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (local_1440->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_00690be6:
                      local_1458->tfar = -INFINITY;
                      return;
                    }
                    local_1450 = context->args;
                    local_12d8 = auVar56._0_32_;
                    local_12b8 = auVar55._0_32_;
                    local_1298 = auVar54._0_32_;
                    local_1278 = auVar53._0_32_;
                    local_1258 = auVar52._0_32_;
                    local_1238 = auVar51._0_32_;
                    local_1218 = auVar50._0_32_;
                    local_11f8 = auVar49._0_32_;
                    uVar16 = (ulong)(uint)((int)local_1438 * 4);
                    local_13d8.context = context->user;
                    local_1408 = *(undefined4 *)(local_1308 + uVar16);
                    local_1404 = *(undefined4 *)(local_12f8 + uVar16);
                    local_1400 = *(undefined4 *)(local_12e8 + uVar16);
                    local_13fc = *(undefined4 *)((long)local_1338 + uVar16);
                    local_13f8 = *(undefined4 *)(local_1328 + uVar16);
                    local_13f4 = *(undefined4 *)((long)&local_13a8 + uVar16);
                    local_13ec = (local_13d8.context)->instID[0];
                    local_13e8 = (local_13d8.context)->instPrimID[0];
                    fVar40 = local_1458->tfar;
                    local_1458->tfar = *(float *)((long)local_1318 + uVar16);
                    local_145c = -1;
                    local_13d8.valid = &local_145c;
                    local_13d8.geometryUserPtr = local_1440->userPtr;
                    local_13d8.hit = (RTCHitN *)&local_1408;
                    local_13d8.N = 1;
                    local_13d8.ray = (RTCRayN *)local_1458;
                    if (((local_1440->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                        ((*local_1440->occlusionFilterN)(&local_13d8), *local_13d8.valid != 0)) &&
                       ((local_1450->filter == (RTCFilterFunctionN)0x0 ||
                        ((((local_1450->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                           RTC_RAY_QUERY_FLAG_INCOHERENT &&
                          (((local_1440->field_8).field_0x2 & 0x40) == 0)) ||
                         ((*local_1450->filter)(&local_13d8), *local_13d8.valid != 0))))))
                    goto LAB_00690be6;
                    local_1458->tfar = fVar40;
                    local_1430 = local_1430 ^ 1L << (local_1438 & 0x3f);
                    auVar49 = ZEXT3264(local_11f8);
                    auVar50 = ZEXT3264(local_1218);
                    auVar51 = ZEXT3264(local_1238);
                    auVar52 = ZEXT3264(local_1258);
                    auVar53 = ZEXT3264(local_1278);
                    auVar54 = ZEXT3264(local_1298);
                    auVar55 = ZEXT3264(local_12b8);
                    auVar56 = ZEXT3264(local_12d8);
                    auVar22 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar57 = ZEXT1664(auVar22);
                    auVar22 = vmovddup_avx512vl(ZEXT816(0x8000000080000000));
                    auVar58 = ZEXT1664(auVar22);
                    auVar25 = vxorps_avx512vl(auVar25,auVar25);
                    auVar59 = ZEXT1664(auVar25);
                    auVar25 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar60 = ZEXT1664(auVar25);
                  }
                } while (local_1430 != 0);
              }
            }
            local_1418 = local_1418 + 1;
          } while (local_1418 != local_1410);
        }
LAB_00690bc3:
      } while (local_1420 != &local_11d8);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }